

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O2

void toml::detail::skip_comment_block<toml::type_config>
               (location *loc,context<toml::type_config> *ctx)

{
  element_type *peVar1;
  char_type_conflict cVar2;
  either eStack_b8;
  region local_98;
  
LAB_002e05ca:
  do {
    while( true ) {
      peVar1 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if ((ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start) <= loc->location_) {
        return;
      }
      skip_whitespace<toml::type_config>(loc,ctx);
      cVar2 = location::current(loc);
      if (cVar2 == '#') break;
      syntax::newline(&eStack_b8,&ctx->toml_spec_);
      either::scan(&local_98,&eStack_b8,loc);
      peVar1 = local_98.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      region::~region(&local_98);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector(&eStack_b8.others_);
      if (peVar1 == (element_type *)0x0) {
        return;
      }
    }
    do {
      peVar1 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if ((ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start) <= loc->location_)
      goto LAB_002e05ca;
      cVar2 = location::current(loc);
    } while (cVar2 != '\n');
    location::advance(loc,1);
  } while( true );
}

Assistant:

void skip_comment_block(location& loc, const context<TC>& ctx)
{
    while( ! loc.eof())
    {
        skip_whitespace(loc, ctx);
        if(loc.current() == '#')
        {
            while( ! loc.eof())
            {
                // both CRLF and LF ends with LF.
                if(loc.current() == '\n')
                {
                    loc.advance();
                    break;
                }
            }
        }
        else if(syntax::newline(ctx.toml_spec()).scan(loc).is_ok())
        {
            ; // an empty line. skip this also
        }
        else
        {
            // the next token is neither a comment nor empty line.
            return ;
        }
    }
    return ;
}